

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
libebml::EbmlMaster::FindAllMissingElements_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,EbmlMaster *this)

{
  EbmlMaster *this_00;
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  EbmlElement *pEVar4;
  reference ppEVar5;
  size_type sVar6;
  reference __x;
  undefined1 local_b0 [8];
  string missingElement;
  ulong uStack_88;
  uint EltIdx;
  size_t s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  childMissingElements;
  EbmlMaster *childMaster;
  string missingValue;
  EbmlElement *childElement;
  size_t ChildElementNo;
  EbmlMaster *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *missingElements;
  
  sVar3 = EbmlSemanticContext::GetSize(this->Context);
  if (sVar3 != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__);
    for (childElement = (EbmlElement *)0x0;
        pEVar4 = (EbmlElement *)
                 std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::size
                           (&this->ElementList), childElement < pEVar4;
        childElement = (EbmlElement *)((long)&childElement->_vptr_EbmlElement + 1)) {
      ppEVar5 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::
                operator[](&this->ElementList,(size_type)childElement);
      this_00 = (EbmlMaster *)*ppEVar5;
      bVar1 = EbmlElement::ValueIsSet((EbmlElement *)this_00);
      if (!bVar1) {
        std::__cxx11::string::string((string *)&childMaster);
        std::__cxx11::string::operator=((string *)&childMaster,"The Child Element \"");
        (*(this_00->super_EbmlElement)._vptr_EbmlElement[4])();
        std::__cxx11::string::append((char *)&childMaster);
        std::__cxx11::string::append((char *)&childMaster);
        (*(this->super_EbmlElement)._vptr_EbmlElement[4])();
        std::__cxx11::string::append((char *)&childMaster);
        std::__cxx11::string::append((char *)&childMaster);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)&childMaster);
        std::__cxx11::string::~string((string *)&childMaster);
      }
      uVar2 = (*(this_00->super_EbmlElement)._vptr_EbmlElement[0xe])();
      if ((uVar2 & 1) != 0) {
        childMissingElements.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this_00;
        FindAllMissingElements_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&s,this_00);
        for (uStack_88 = 0;
            sVar6 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&s), uStack_88 < sVar6; uStack_88 = uStack_88 + 1) {
          __x = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&s,uStack_88);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,__x);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&s);
      }
    }
    for (missingElement.field_2._12_4_ = 0;
        (ulong)(uint)missingElement.field_2._12_4_ < this->Context->Size;
        missingElement.field_2._12_4_ = missingElement.field_2._12_4_ + 1) {
      bVar1 = EbmlSemantic::IsMandatory
                        (this->Context->MyTable + (uint)missingElement.field_2._12_4_);
      if ((bVar1) &&
         (pEVar4 = FindElt(this,this->Context->MyTable[(uint)missingElement.field_2._12_4_].
                                GetCallbacks), pEVar4 == (EbmlElement *)0x0)) {
        std::__cxx11::string::string((string *)local_b0);
        std::__cxx11::string::operator=((string *)local_b0,"Missing element \"");
        std::__cxx11::string::append(local_b0);
        std::__cxx11::string::append(local_b0);
        std::__cxx11::string::append(local_b0);
        std::__cxx11::string::append(local_b0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)local_b0);
        std::__cxx11::string::~string((string *)local_b0);
      }
    }
    return __return_storage_ptr__;
  }
  __assert_fail("Context.GetSize() != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/EbmlMaster.cpp"
                ,0xe2,"std::vector<std::string> libebml::EbmlMaster::FindAllMissingElements()");
}

Assistant:

std::vector<std::string> EbmlMaster::FindAllMissingElements()
{
  assert(Context.GetSize() != 0);

  std::vector<std::string> missingElements;

  for (size_t ChildElementNo = 0; ChildElementNo < ElementList.size(); ChildElementNo++) {
       EbmlElement *childElement = ElementList[ChildElementNo];
    if (!childElement->ValueIsSet()) {
      std::string missingValue;
      missingValue = "The Child Element \"";
      missingValue.append(EBML_NAME(childElement));
      missingValue.append("\" of EbmlMaster \"");
      missingValue.append(EBML_NAME(this));
      missingValue.append("\", does not have a value set.");
      missingElements.push_back(missingValue);
    }

    if (childElement->IsMaster()) {
      EbmlMaster *childMaster = (EbmlMaster *)childElement;

      std::vector<std::string> childMissingElements = childMaster->FindAllMissingElements();
      for (size_t s = 0; s < childMissingElements.size(); s++)
        missingElements.push_back(childMissingElements[s]);
    }
  }
  unsigned int EltIdx;
  for (EltIdx = 0; EltIdx < EBML_CTX_SIZE(Context); EltIdx++) {
    if (EBML_CTX_IDX(Context,EltIdx).IsMandatory()) {
      if (FindElt(EBML_CTX_IDX_INFO(Context,EltIdx)) == NULL) {
        std::string missingElement;
        missingElement = "Missing element \"";
                missingElement.append(EBML_INFO_NAME(EBML_CTX_IDX_INFO(Context,EltIdx)));
        missingElement.append("\" in EbmlMaster \"");
                missingElement.append(EBML_INFO_NAME(*EBML_CTX_MASTER(Context)));
        missingElement.append("\"");
        missingElements.push_back(missingElement);
      }
    }
  }

  return missingElements;
}